

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
::
Set_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>>>>
          (Set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
           *this,Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                 *column,Index columnIndex,
          map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  _Base_ptr p_Var1;
  Field_operators *pFVar2;
  _Base_ptr p_Var3;
  iterator local_30;
  
  *(Index *)this = columnIndex;
  *(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  *(undefined8 *)(this + 0x10) = *(undefined8 *)&column->super_Column_dimension_option;
  *(Index *)(this + 0x18) = (column->super_Chain_column_option).pairedColumn_;
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  p_Var1 = (_Base_ptr)(this + 0x28);
  *(_Base_ptr *)(this + 0x38) = p_Var1;
  *(_Base_ptr *)(this + 0x40) = p_Var1;
  *(undefined8 *)(this + 0x48) = 0;
  pFVar2 = (Field_operators *)0x0;
  if (colSettings == (Column_settings *)0x0) {
    pFVar2 = column->operators_;
  }
  *(Field_operators **)(this + 0x50) = pFVar2;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  *(Column_settings **)(this + 0x58) = colSettings;
  for (p_Var3 = (column->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(column->column_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_30._M_node = p_Var1;
    Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
    ::_insert_entry((Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                     *)this,*(ID_index *)(*(long *)(p_Var3 + 1) + 4),&local_30);
  }
  return;
}

Assistant:

inline Set_column<Master_matrix>::Set_column(const Set_column& column,
                                             Index columnIndex,
                                             Row_container* rowContainer,
                                             Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _insert_entry(entry->get_row_index(), column_.end());
    } else {
      _insert_entry(entry->get_element(), entry->get_row_index(), column_.end());
    }
  }
}